

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compress.cc
# Opt level: O0

void __thiscall compress_basic_Test::~compress_basic_Test(compress_basic_Test *this)

{
  testing::Test::~Test((Test *)0x11828e);
  return;
}

Assistant:

TEST(compress, basic) {
    uint8_t compr[128], uncompr[128];
    z_uintmax_t compr_len = sizeof(compr), uncompr_len = sizeof(uncompr);
    int err;

    err = PREFIX(compress)(compr, &compr_len, (const unsigned char *)hello, hello_len);
    EXPECT_EQ(err, Z_OK);

    strcpy((char*)uncompr, "garbage");

    err = PREFIX(uncompress)(uncompr, &uncompr_len, compr, compr_len);
    EXPECT_EQ(err, Z_OK);

    EXPECT_STREQ((char *)uncompr, (char *)hello);
}